

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void captureCursor(_GLFWwindow *window)

{
  int iVar1;
  _GLFWwindow *window_local;
  
  hideCursor(window);
  if (((window->x11).cursorGrabbed == '\0') &&
     (iVar1 = XGrabPointer(_glfw.x11.display,(window->x11).handle,1,0x4c,1,1,(window->x11).handle,0,
                           0), iVar1 == 0)) {
    (window->x11).cursorGrabbed = '\x01';
  }
  return;
}

Assistant:

static void captureCursor(_GLFWwindow* window)
{
    hideCursor(window);

    if (!window->x11.cursorGrabbed)
    {
        if (XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                         ButtonPressMask | ButtonReleaseMask |
                         PointerMotionMask, GrabModeAsync, GrabModeAsync,
                         window->x11.handle, None, CurrentTime) ==
            GrabSuccess)
        {
            window->x11.cursorGrabbed = GL_TRUE;
        }
    }
}